

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall cfd::Psbt::SetWitnessUtxoData(Psbt *this,UtxoData *utxo)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_128;
  OutPoint local_110;
  Script local_e8;
  TxOut local_b0;
  AbstractTxOutReference local_60;
  
  cfd::core::OutPoint::OutPoint(&local_110);
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_e8);
  cfd::core::TxOut::TxOut(&local_b0);
  ConvertFromUtxoData(utxo,&local_110,&local_b0,&local_128,&local_e8,false,(NetType *)0x0);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_60,&local_b0);
  SetTxInUtxo(this,&local_110,(TxOutReference *)&local_60,&local_e8,&local_128);
  core::AbstractTxOutReference::~AbstractTxOutReference(&local_60);
  core::AbstractTxOut::~AbstractTxOut(&local_b0.super_AbstractTxOut);
  core::Script::~Script(&local_e8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_128);
  core::Txid::~Txid(&local_110.txid_);
  return;
}

Assistant:

void Psbt::SetWitnessUtxoData(const UtxoData& utxo) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  TxOut txout;
  ConvertFromUtxoData(utxo, &outpoint, &txout, &key_list, &redeem_script);
  SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
}